

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

bool __thiscall
jrtplib::RTPUDPv4Transmitter::ComesFromThisTransmitter(RTPUDPv4Transmitter *this,RTPAddress *addr)

{
  _List_node_base *p_Var1;
  bool bVar2;
  
  if ((((addr == (RTPAddress *)0x0) || (this->init == false)) || (this->created != true)) ||
     (addr->addresstype != IPv4Address)) {
    return false;
  }
  bVar2 = false;
  p_Var1 = (_List_node_base *)&this->localIPs;
  do {
    p_Var1 = (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    do {
      if (bVar2) {
        if (*(uint16_t *)&addr[1]._vptr_RTPAddress == this->m_rtpPort) {
          return true;
        }
        return *(uint16_t *)&addr[1]._vptr_RTPAddress == this->m_rtcpPort;
      }
      if (p_Var1 == (_List_node_base *)&this->localIPs) {
        return false;
      }
      bVar2 = *(int *)&addr->field_0xc == *(int *)&p_Var1[1]._M_next;
    } while (bVar2);
  } while( true );
}

Assistant:

bool RTPUDPv4Transmitter::ComesFromThisTransmitter(const RTPAddress *addr)
{
	if (!init)
		return false;

	if (addr == 0)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (created && addr->GetAddressType() == RTPAddress::IPv4Address)
	{	
		const RTPIPv4Address *addr2 = (const RTPIPv4Address *)addr;
		bool found = false;
		std::list<uint32_t>::const_iterator it;
	
		it = localIPs.begin();
		while (!found && it != localIPs.end())
		{
			if (addr2->GetIP() == *it)
				found = true;
			else
				++it;
		}
	
		if (!found)
			v = false;
		else
		{
			if (addr2->GetPort() == m_rtpPort || addr2->GetPort() == m_rtcpPort) // check for RTP port and RTCP port
				v = true;
			else 
				v = false;
		}
	}
	else
		v = false;

	MAINMUTEX_UNLOCK
	return v;
}